

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseComponent.h
# Opt level: O2

void BaseComponent::Publish<std::__cxx11::string>
               (UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *ev)

{
  mapped_type *pmVar1;
  undefined8 uVar2;
  ulong uVar3;
  Type type;
  key_type local_24;
  
  std::mutex::lock(&eventsLock);
  Event::GetType(&ev->super_Event);
  uVar3 = 0;
  while( true ) {
    pmVar1 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&events,&local_24);
    if ((ulong)((long)(pmVar1->super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pmVar1->super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) {
      pthread_mutex_unlock((pthread_mutex_t *)&eventsLock);
      return;
    }
    pmVar1 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&events,&local_24);
    if ((pmVar1->super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar3] == (BaseComponent *)0x0) break;
    pmVar1 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&events,&local_24);
    AddEvent<std::__cxx11::string>
              ((pmVar1->super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar3],ev);
    uVar3 = uVar3 + 1;
  }
  uVar2 = __cxa_rethrow();
  pthread_mutex_unlock((pthread_mutex_t *)&eventsLock);
  _Unwind_Resume(uVar2);
}

Assistant:

static void Publish(const UserEvent<T> &ev) {
            std::lock_guard<std::mutex> lock(eventsLock);
            Event::Type type = ev.GetType();

            for(size_t i = 0; i < events[type].size(); ++i) {
                if(events[type][i] == nullptr) {
                    throw;
                }

                events[type][i]->AddEvent<T>(ev);
            }
        }